

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

string * replace(string *s,string *from,string *to)

{
  ulong uVar1;
  string *psVar2;
  ulong in_RDX;
  string *in_RSI;
  string *in_RDI;
  size_t pos;
  string *result;
  
  std::__cxx11::string::string((string *)in_RDI,in_RSI);
  while (uVar1 = std::__cxx11::string::find((string *)in_RDI,in_RDX), uVar1 != 0xffffffffffffffff) {
    psVar2 = (string *)std::__cxx11::string::length();
    std::__cxx11::string::replace((ulong)in_RDI,uVar1,psVar2);
    std::__cxx11::string::length();
  }
  return in_RDI;
}

Assistant:

std::string replace(const std::string & s, const std::string & from, const std::string & to) {
    std::string result = s;
    size_t pos = 0;
    while ((pos = result.find(from, pos)) != std::string::npos) {
        result.replace(pos, from.length(), to);
        pos += to.length();
    }
    return result;
}